

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Maybe<capnp::DynamicValue::Reader> * __thiscall
capnp::compiler::NodeTranslator::readConstant
          (Maybe<capnp::DynamicValue::Reader> *__return_storage_ptr__,NodeTranslator *this,
          Reader source,bool isBootstrap)

{
  BrandedDecl *pBVar1;
  Resolver *pRVar2;
  ErrorReporter *pEVar3;
  PointerReader reader;
  Builder target;
  Field field;
  ImplicitParams implicitMethodParams;
  undefined1 auVar4 [40];
  PointerReader reader_00;
  Reader name;
  Reader name_00;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  Type TVar7;
  RawBrandedSchema *pRVar8;
  byte bVar9;
  ConstSchema CVar10;
  char *pcVar11;
  undefined8 uVar12;
  uint uVar13;
  _func_int **pp_Var14;
  undefined7 in_register_00000011;
  SegmentReader *pSVar15;
  word *pwVar16;
  long lVar17;
  ulong uVar18;
  size_t sVar19;
  char (*in_R8) [32];
  ulong uVar20;
  ulong uVar21;
  BrandScope *pBVar22;
  ulong uVar23;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  ListSchema schema;
  Reader RVar30;
  Builder scope;
  Reader proto;
  Type constType;
  Builder bindings;
  Schema constSchema;
  Reader objValue;
  Reader constValue;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamicConst;
  MallocMessageBuilder builder;
  Builder constBrand;
  BrandedDecl constDecl;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  StructDataBitCount SVar34;
  undefined8 uVar35;
  Type TVar36;
  undefined8 uVar37;
  undefined2 uVar38;
  undefined2 uVar39;
  undefined4 uVar40;
  undefined2 uVar41;
  undefined2 uVar42;
  undefined4 uVar43;
  undefined2 uVar44;
  undefined1 uVar45;
  undefined1 in_stack_fffffffffffffb17;
  undefined4 uVar46;
  undefined4 in_stack_fffffffffffffb1c;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined1 local_4c8 [16];
  SegmentReader *local_4b8;
  WirePointer *pWStack_4b0;
  uint local_4a8;
  ushort uStack_4a4;
  undefined2 uStack_4a2;
  int iStack_4a0;
  Type local_498;
  WirePointer *local_488;
  Maybe<capnp::DynamicValue::Reader> *local_478;
  undefined4 local_46c;
  undefined1 local_468 [8];
  anon_union_8_2_eba6ea51_for_Type_5 aStack_460;
  undefined7 uStack_458;
  undefined1 uStack_451;
  uint uStack_450;
  BitsPerElementN<23> BStack_44c;
  uint uStack_448;
  StructPointerCount SStack_444;
  ElementSize EStack_442;
  undefined1 local_441;
  ListElementCount LStack_440;
  BitsPerElementN<23> BStack_43c;
  undefined7 uStack_438;
  undefined1 uStack_431;
  undefined7 uStack_430;
  undefined1 uStack_429;
  undefined7 uStack_428;
  Schema local_420;
  char *local_418;
  long local_410;
  undefined1 local_408 [12];
  undefined4 uStack_3fc;
  WirePointer *local_3f8;
  ListElementCount LStack_3f0;
  undefined4 uStack_3ec;
  undefined8 local_3e8;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_3b8;
  ulong local_300;
  ulong local_2f8;
  BrandScope *local_2f0;
  ArrayPtr<const_char> local_2e8;
  undefined1 local_2d8 [64];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  ArrayDisposer *local_258;
  undefined8 *puStack_250;
  undefined8 *local_248;
  void *pvStack_240;
  void *local_238;
  char local_230;
  void *local_228;
  void *pvStack_220;
  void *local_218;
  void *pvStack_210;
  void *local_208;
  void *pvStack_200;
  Disposer *local_1f8;
  BrandScope *pBStack_1f0;
  SegmentReader *local_1e8;
  CapTableReader *pCStack_1e0;
  void *local_1d8;
  WirePointer *pWStack_1d0;
  void *local_1c8;
  void *pvStack_1c0;
  undefined8 local_178;
  WirePointer *pWStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  StructBuilder local_138;
  BrandedDecl local_108;
  ulong uVar24;
  
  local_46c = (undefined4)CONCAT71(in_register_00000011,isBootstrap);
  local_108.body.tag = 0;
  local_108.brand.disposer = (Disposer *)0x0;
  local_108.brand.ptr = (BrandScope *)0x0;
  local_108.source._reader.segment = (SegmentReader *)0x0;
  local_108.source._reader.capTable = (CapTableReader *)0x0;
  local_108.source._reader.data = (void *)0x0;
  local_108.source._reader.pointers._0_6_ = 0;
  local_108.source._reader.pointers._6_2_ = 0;
  local_108.source._reader.dataSize = 0;
  local_108.source._reader.pointerCount = 0;
  local_108.source._reader.nestingLimit = 0x7fffffff;
  uVar40 = 0;
  uVar41 = 0;
  uVar42 = 0;
  uVar43 = 0;
  uVar44 = 0;
  uVar37 = (WirePointer *)0x0;
  uVar29 = 0;
  uVar38 = 0;
  uVar39 = 0;
  TVar36 = UNKNOWN;
  uVar26 = 0;
  uVar27 = 0;
  uVar28 = 0;
  uVar45 = INLINE_COMPOSITE;
  uVar46 = 0x7fffffff;
  uVar35 = CONCAT44(in_stack_fffffffffffffb1c,0x7fffffff);
  uVar12 = CONCAT17(in_stack_fffffffffffffb17,0x7000000000000);
  uVar31 = source._reader.data._0_4_;
  uVar32 = source._reader.data._4_4_;
  uVar33 = source._reader.pointers._0_4_;
  auVar4 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.params.reader.structDataSize = (int)0x7000000000000;
  implicitMethodParams.params.reader.structPointerCount = (short)(0x7000000000000 >> 0x20);
  implicitMethodParams.params.reader.elementSize = (char)(0x7000000000000 >> 0x30);
  implicitMethodParams.params.reader._39_1_ = in_stack_fffffffffffffb17;
  implicitMethodParams.scopeId = auVar4._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar4._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar4._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar4._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar4._32_4_;
  implicitMethodParams.params.reader.step = auVar4._36_4_;
  implicitMethodParams.params.reader._40_8_ = uVar35;
  BrandScope::compileDeclExpression
            (&local_3b8,(this->localBrand).ptr,source,this->resolver,implicitMethodParams);
  bVar25 = local_3b8.ptr.isSet;
  local_268[0] = local_3b8.ptr.isSet;
  if (local_3b8.ptr.isSet == true) {
    local_268._8_4_ = local_3b8.ptr.field_1.value.body.tag;
    if (local_3b8.ptr.field_1.value.body.tag == 2) {
      local_258 = (ArrayDisposer *)local_3b8.ptr.field_1._8_8_;
      puStack_250 = (undefined8 *)local_3b8.ptr.field_1._16_8_;
    }
    else if (local_3b8.ptr.field_1.value.body.tag == 1) {
      local_238 = (void *)local_3b8.ptr.field_1._40_8_;
      local_248 = (undefined8 *)local_3b8.ptr.field_1._24_8_;
      pvStack_240 = (void *)local_3b8.ptr.field_1._32_8_;
      local_258 = (ArrayDisposer *)local_3b8.ptr.field_1._8_8_;
      puStack_250 = (undefined8 *)local_3b8.ptr.field_1._16_8_;
      local_230 = local_3b8.ptr.field_1._48_1_;
      if (local_3b8.ptr.field_1._48_1_ == '\x01') {
        local_208 = (void *)local_3b8.ptr.field_1._88_8_;
        pvStack_200 = (void *)local_3b8.ptr.field_1._96_8_;
        local_218 = (void *)local_3b8.ptr.field_1._72_8_;
        pvStack_210 = (void *)local_3b8.ptr.field_1._80_8_;
        local_228 = (void *)local_3b8.ptr.field_1._56_8_;
        pvStack_220 = (void *)local_3b8.ptr.field_1._64_8_;
      }
    }
    local_1f8 = local_3b8.ptr.field_1.value.brand.disposer;
    pBStack_1f0 = local_3b8.ptr.field_1.value.brand.ptr;
    local_1e8 = local_3b8.ptr.field_1.value.source._reader.segment;
    pCStack_1e0 = local_3b8.ptr.field_1.value.source._reader.capTable;
    local_1d8 = local_3b8.ptr.field_1.value.source._reader.data;
    pWStack_1d0 = local_3b8.ptr.field_1.value.source._reader.pointers;
    local_1c8 = (void *)local_3b8.ptr.field_1._152_8_;
    pvStack_1c0 = (void *)local_3b8.ptr.field_1._160_8_;
    BrandedDecl::operator=(&local_108,(BrandedDecl *)(local_268 + 8));
    bVar9 = local_268[0];
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
    bVar9 = local_3b8.ptr.isSet;
  }
  pBVar22 = pBStack_1f0;
  if ((bVar9 & 1) != 0) {
    if (pBStack_1f0 != (BrandScope *)0x0) {
      pBStack_1f0 = (BrandScope *)0x0;
      (**local_1f8->_vptr_Disposer)
                (local_1f8,
                 (pBVar22->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pBVar22->super_Refcounted).super_Disposer._vptr_Disposer);
    }
    if (local_268._8_4_ - 1 < 2) {
      local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
    }
  }
  if (bVar25 == false) goto LAB_00437bfa;
  if ((local_108.body.tag == 2) || (local_108.body.field_1._24_2_ != 2)) {
    pEVar3 = this->errorReporter;
    name._reader.segment._4_4_ = uVar28;
    name._reader.segment._0_4_ = uVar27;
    name._reader.capTable = (CapTableReader *)uVar37;
    name._reader.data._0_4_ = uVar29;
    name._reader.data._4_2_ = uVar38;
    name._reader.data._6_2_ = uVar39;
    name._reader.pointers._0_4_ = uVar40;
    name._reader.pointers._4_2_ = uVar41;
    name._reader.pointers._6_2_ = uVar42;
    name._reader.dataSize = uVar43;
    name._reader.pointerCount = uVar44;
    name._reader._38_1_ = uVar45;
    name._reader._39_1_ = in_stack_fffffffffffffb17;
    name._reader.nestingLimit = uVar46;
    name._reader._44_4_ = in_stack_fffffffffffffb1c;
    SVar34 = source._reader.dataSize;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[32]>
              ((String *)local_268,(kj *)0x549530,(char (*) [2])&local_3b8,
               (String *)"\' does not refer to a constant.",in_R8);
    pp_Var14 = (_func_int **)local_268._0_8_;
    if ((void *)local_268._8_8_ == (void *)0x0) {
      pp_Var14 = (_func_int **)0x4f5114;
    }
    uVar21 = 0;
    if (source._reader.dataSize < 0x40) {
      uVar23 = 0;
    }
    else {
      uVar23 = (ulong)*(uint *)((long)source._reader.data + 4);
      if (0x9f < source._reader.dataSize) {
        uVar21 = (ulong)*(uint *)((long)source._reader.data + 0x10);
      }
    }
    (**pEVar3->_vptr_ErrorReporter)
              (pEVar3,uVar23,uVar21,pp_Var14,
               local_268._8_8_ + (ulong)((void *)local_268._8_8_ == (void *)0x0));
    uVar35 = local_268._8_8_;
    uVar12 = local_268._0_8_;
    if ((_func_int **)local_268._0_8_ != (_func_int **)0x0) {
      local_268._0_8_ = (_func_int **)0x0;
      local_268._8_8_ = (void *)0x0;
      (**local_258->_vptr_ArrayDisposer)
                (local_258,uVar12,1,uVar35,uVar35,0,source._reader.segment._0_4_,
                 source._reader.capTable._0_4_,uVar31,uVar33,SVar34,source._reader.nestingLimit);
    }
    uVar35 = local_3b8.ptr.field_1._0_8_;
    uVar12 = local_3b8.ptr._0_8_;
    if ((SegmentBuilder *)local_3b8.ptr._0_8_ != (SegmentBuilder *)0x0) {
      local_3b8.ptr._0_8_ = (SegmentBuilder *)0x0;
      local_3b8.ptr.field_1._0_8_ = (undefined8 *)0x0;
      (*(code *)**(undefined8 **)local_3b8.ptr.field_1._8_8_)
                (local_3b8.ptr.field_1._8_8_,uVar12,1,uVar35,uVar35,0);
    }
    (__return_storage_ptr__->ptr).isSet = false;
    goto LAB_00437bfa;
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_268,0x100,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&stack0xfffffffffffffae8,(MessageBuilder *)local_268);
  local_3b8.ptr._0_8_ = CONCAT44(uVar26,TVar36);
  local_3b8.ptr.field_1._0_8_ = CONCAT44(uVar28,uVar27);
  local_3b8.ptr.field_1._8_8_ = uVar37;
  capnp::_::PointerBuilder::getStruct
            (&local_138,(PointerBuilder *)&local_3b8,(StructSize)0x10000,(word *)0x0);
  if (local_108.body.tag != 1) {
    local_3b8.ptr._0_8_ = (SegmentBuilder *)0x0;
    local_3b8.ptr.field_1._0_8_ = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&stack0xfffffffffffffae8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffae8);
  }
  local_4c8._0_8_ = (SegmentReader *)0x0;
  local_4c8._8_8_ = (SegmentReader *)0x0;
  local_4b8 = (SegmentReader *)0x0;
  pSVar15 = (SegmentReader *)0x0;
  local_2f0 = local_108.brand.ptr;
  pBVar22 = local_108.brand.ptr;
  local_478 = __return_storage_ptr__;
  do {
    if (((pBVar22->params).size_ != 0) ||
       ((pBVar22->inherited == true && (pBVar22->leafParamCount != 0)))) {
      if (pSVar15 == local_4b8) {
        sVar19 = (long)pSVar15 - local_4c8._0_8_ >> 2;
        if (pSVar15 == (SegmentReader *)local_4c8._0_8_) {
          sVar19 = 4;
        }
        kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::setCapacity
                  ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)local_4c8,sVar19);
        pSVar15 = (SegmentReader *)local_4c8._8_8_;
      }
      pSVar15->arena = (Arena *)pBVar22;
      pSVar15 = (SegmentReader *)(local_4c8._8_8_ + 8);
      local_4c8._8_8_ = pSVar15;
    }
    pBVar22 = (pBVar22->parent).ptr.ptr;
  } while (pBVar22 != (BrandScope *)0x0);
  if ((long)pSVar15 - local_4c8._0_8_ != 0) {
    TVar36 = (Type)local_138.segment;
    uVar33 = (undefined4)((ulong)local_138.segment >> 0x20);
    uVar26 = SUB84(local_138.capTable,0);
    uVar27 = (undefined4)((ulong)local_138.capTable >> 0x20);
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)&local_3b8,(PointerBuilder *)&stack0xfffffffffffffae8,
               (ElementCount)((ulong)((long)pSVar15 - local_4c8._0_8_) >> 3),(StructSize)0x10002);
    if (local_4c8._8_8_ - local_4c8._0_8_ != 0) {
      uVar21 = (long)(local_4c8._8_8_ - local_4c8._0_8_) >> 3;
      uVar23 = 0;
      uVar37 = local_138.pointers;
      local_300 = uVar21;
      do {
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&stack0xfffffffffffffae8,(ListBuilder *)&local_3b8,
                   (ElementCount)uVar23);
        pBVar22 = (BrandScope *)((Arena **)local_4c8._0_8_)[uVar23 & 0xffffffff];
        *(uint64_t *)&((SegmentReader *)uVar37)->arena = pBVar22->leafId;
        if (pBVar22->inherited == true) {
          *(undefined2 *)&(((SegmentReader *)uVar37)->id).value = 1;
          uVar24 = uVar23;
        }
        else {
          sVar19 = (pBVar22->params).size_;
          *(undefined2 *)&(((SegmentReader *)uVar37)->id).value = 0;
          local_2d8._16_8_ = CONCAT26(uVar39,CONCAT24(uVar38,uVar29));
          local_2d8._4_4_ = uVar33;
          local_2d8._0_4_ = TVar36;
          local_2d8._12_4_ = uVar27;
          local_2d8._8_4_ = uVar26;
          local_2f8 = uVar23;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)local_468,(PointerBuilder *)local_2d8,(ElementCount)sVar19,
                     (StructSize)0x10001);
          uVar18 = (ulong)uStack_450;
          uVar21 = local_300;
          uVar24 = local_2f8;
          if (uVar18 != 0) {
            lVar17 = 0;
            uVar20 = 0;
            do {
              pBVar1 = (((BrandScope *)((Arena **)local_4c8._0_8_)[uVar23 & 0xffffffff])->params).
                       ptr;
              pEVar3 = local_2f0->errorReporter;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_2d8,(ListBuilder *)local_468,(ElementCount)uVar20);
              *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_2d8._16_8_)->value = 1;
              local_498.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_2d8._8_8_;
              local_498.baseType = local_2d8._0_2_;
              local_498.listDepth = local_2d8[2];
              local_498.isImplicitParam = (bool)local_2d8[3];
              local_498.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_2d8._4_2_;
              local_498._6_2_ = local_2d8._6_2_;
              local_488 = (WirePointer *)local_2d8._24_8_;
              capnp::_::PointerBuilder::initStruct
                        ((StructBuilder *)local_408,(PointerBuilder *)&local_498,(StructSize)0x10003
                        );
              target._builder.capTable._0_4_ = (int)stack0xfffffffffffffc00;
              target._builder.segment = (SegmentBuilder *)local_408._0_8_;
              target._builder.capTable._4_4_ = (int)((ulong)stack0xfffffffffffffc00 >> 0x20);
              target._builder.data._0_4_ = (int)local_3f8;
              target._builder.data._4_4_ = (int)((ulong)local_3f8 >> 0x20);
              target._builder.pointers._0_4_ = LStack_3f0;
              target._builder.pointers._4_4_ = uStack_3ec;
              target._builder.dataSize = (StructDataBitCount)local_3e8;
              target._builder._36_4_ = SUB84(local_3e8,4);
              BrandedDecl::compileAsType
                        ((BrandedDecl *)((long)&(pBVar1->body).tag + lVar17),pEVar3,target);
              uVar20 = uVar20 + 1;
              lVar17 = lVar17 + 0xa8;
              uVar21 = local_300;
              uVar24 = local_2f8;
            } while (uVar18 != uVar20);
          }
        }
        uVar23 = uVar24 + 1;
      } while (uVar23 != uVar21);
    }
  }
  pSVar15 = local_4b8;
  uVar6 = local_4c8._8_8_;
  uVar37 = local_4c8._0_8_;
  if ((SegmentReader *)local_4c8._0_8_ != (SegmentReader *)0x0) {
    local_4c8._0_8_ = (SegmentReader *)0x0;
    local_4c8._8_8_ = (SegmentReader *)0x0;
    local_4b8 = (SegmentReader *)0x0;
    (**(_func_int **)*pWStack_4b0)
              (pWStack_4b0,uVar37,8,(long)(uVar6 - uVar37) >> 3,(long)pSVar15 - uVar37 >> 3,0);
  }
  local_420.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  pRVar2 = this->resolver;
  capnp::_::StructBuilder::asReader(&local_138);
  (*pRVar2->_vptr_Resolver[6])(&local_3b8,pRVar2,local_108.body.field_1.forceAligned);
  __return_storage_ptr__ = local_478;
  if (local_3b8.ptr.isSet == true) {
    local_420.raw = (RawBrandedSchema *)local_3b8.ptr.field_1._0_8_;
    Schema::getProto((Reader *)local_4c8,&local_420);
    __return_storage_ptr__ = local_478;
    if ((char)local_46c == '\0') {
      (*this->resolver->_vptr_Resolver[7])
                (&local_3b8,this->resolver,local_108.body.field_1.forceAligned);
      if (local_3b8.ptr.isSet != true) goto LAB_00437583;
      local_4c8._0_8_ = local_3b8.ptr.field_1._0_8_;
      local_4c8._8_8_ = local_3b8.ptr.field_1._8_8_;
      local_4b8 = (SegmentReader *)local_3b8.ptr.field_1._16_8_;
      pWStack_4b0 = (WirePointer *)local_3b8.ptr.field_1._24_8_;
      local_4a8 = local_3b8.ptr.field_1._32_4_;
      uStack_4a4 = local_3b8.ptr.field_1._36_2_;
      uStack_4a2 = local_3b8.ptr.field_1._38_2_;
      _iStack_4a0 = local_3b8.ptr.field_1._40_8_;
    }
    uVar37 = pWStack_4b0 + 4;
    if (uStack_4a4 < 5) {
      uVar27._0_1_ = false;
      uVar27._1_3_ = 0;
      TVar36 = UNKNOWN;
      uVar26 = 0;
      uVar28 = 0;
      uVar33 = 0x7fffffff;
      uVar37 = (WirePointer *)0x0;
    }
    else {
      TVar36 = local_4c8._0_4_;
      uVar26 = local_4c8._4_4_;
      uVar27 = local_4c8._8_4_;
      uVar28 = local_4c8._12_4_;
      uVar33 = iStack_4a0;
    }
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_3b8,(PointerReader *)&stack0xfffffffffffffae8,(word *)0x0);
    local_2d8._8_8_ = local_3b8.ptr._0_8_;
    local_2d8._16_8_ = local_3b8.ptr.field_1._0_8_;
    local_2d8._24_8_ = local_3b8.ptr.field_1._8_8_;
    local_2d8._32_8_ = local_3b8.ptr.field_1._16_8_;
    local_2d8._40_8_ = local_3b8.ptr.field_1._24_8_;
    local_2d8._48_8_ = local_3b8.ptr.field_1._32_8_;
    local_2d8._0_8_ = (long)schemas::s_ce23dcd2d7b00c9b + 0x48;
    DynamicStruct::Reader::which
              ((Maybe<capnp::StructSchema::Field> *)&stack0xfffffffffffffae8,(Reader *)local_2d8);
    if (SUB41(TVar36,0) != true) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_498.field_4.scopeId;
      local_498 = (Type)(auVar5 << 0x40);
      kj::_::Debug::Fault::init
                ((Fault *)&local_498,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_498);
    }
    local_178 = CONCAT44(uVar28,uVar27);
    local_168 = CONCAT26(uVar39,CONCAT24(uVar38,uVar33));
    uStack_160 = CONCAT26(uVar42,CONCAT24(uVar41,uVar40));
    local_158 = CONCAT17(in_stack_fffffffffffffb17,CONCAT16(uVar45,CONCAT24(uVar44,uVar43)));
    uStack_150 = CONCAT44(in_stack_fffffffffffffb1c,uVar46);
    local_468[7] = SUB41(uVar27,0);
    aStack_460.scopeId._0_4_ = (undefined4)((ulong)local_178 >> 8);
    aStack_460.scopeId._7_1_ = (undefined1)uVar37;
    aStack_460._4_3_ = (int3)((uint)uVar28 >> 8);
    uStack_458 = (undefined7)((ulong)uVar37 >> 8);
    uStack_451 = (undefined1)uVar33;
    uStack_450 = (uint)(CONCAT24(uVar38,uVar33) >> 8);
    BStack_44c._0_3_ = (undefined3)((ulong)local_168 >> 0x28);
    BStack_44c._3_1_ = (undefined1)uVar40;
    uStack_448 = (uint)(CONCAT24(uVar41,uVar40) >> 8);
    SStack_444 = (StructPointerCount)((ulong)uStack_160 >> 0x28);
    EStack_442 = (ElementSize)((ushort)uVar42 >> 8);
    local_441 = (undefined1)uVar43;
    LStack_440 = (ListElementCount)(CONCAT24(uVar44,uVar43) >> 8);
    BStack_43c._0_3_ = (undefined3)((ulong)local_158 >> 0x28);
    BStack_43c._3_1_ = (undefined1)uVar46;
    uStack_438 = (undefined7)((ulong)uStack_150 >> 8);
    uStack_431 = (undefined1)local_4e0;
    uStack_430 = (undefined7)((ulong)local_4e0 >> 8);
    uStack_429 = (undefined1)uStack_4d8;
    uStack_428 = (undefined7)((ulong)uStack_4d8 >> 8);
    field.parent.super_Schema.raw._4_4_ = uVar28;
    field.parent.super_Schema.raw._0_4_ = uVar27;
    field.index = (int)uVar37;
    field._12_4_ = (int)((ulong)uVar37 >> 0x20);
    field.proto._reader.segment._0_4_ = uVar33;
    field.proto._reader.segment._4_4_ = (int)((ulong)local_168 >> 0x20);
    field.proto._reader.capTable._0_4_ = uVar40;
    field.proto._reader.capTable._4_4_ = (int)((ulong)uStack_160 >> 0x20);
    field.proto._reader.data._0_4_ = uVar43;
    field.proto._reader.data._4_4_ = (int)((ulong)local_158 >> 0x20);
    field.proto._reader.pointers._0_4_ = uVar46;
    field.proto._reader.pointers._4_4_ = in_stack_fffffffffffffb1c;
    field.proto._reader._32_8_ = local_4e0;
    field.proto._reader._40_8_ = uStack_4d8;
    pWStack_170 = (WirePointer *)uVar37;
    DynamicStruct::Reader::get((Reader *)&local_3b8,(Reader *)local_2d8,field);
    if (local_3b8.ptr._0_4_ == ANY_POINTER) {
      DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
                ((ReaderFor<AnyPointer> *)local_408,(Reader *)&local_3b8);
      CVar10 = Schema::asConst(&local_420);
      TVar36 = (Type)CVar10.super_Schema.raw;
      uVar26 = CVar10.super_Schema.raw._4_4_;
      local_498 = ConstSchema::getType((ConstSchema *)&stack0xfffffffffffffae8);
      uVar13 = 0xe;
      if (((undefined1  [16])local_498 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        uVar13 = local_498._0_4_;
      }
      if ((short)uVar13 == 0xe) {
        schema = Type::asList(&local_498);
        reader.capTable._0_4_ = (int)stack0xfffffffffffffc00;
        reader.segment = (SegmentReader *)local_408._0_8_;
        reader.capTable._4_4_ = (int)((ulong)stack0xfffffffffffffc00 >> 0x20);
        reader.pointer._0_4_ = (int)local_3f8;
        reader.pointer._4_4_ = (int)((ulong)local_3f8 >> 0x20);
        reader.nestingLimit = LStack_3f0;
        reader._28_4_ = uStack_3ec;
        capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                  ((Reader *)local_468,reader,schema);
        TVar36 = LIST;
        uVar37 = CONCAT44(aStack_460.scopeId._4_4_,aStack_460.scopeId._0_4_);
        uVar33 = (undefined4)uStack_458;
        uVar38 = (undefined2)((uint7)uStack_458 >> 0x20);
        uVar39 = (undefined2)(CONCAT17(uStack_451,uStack_458) >> 0x30);
        uVar41 = (undefined2)BStack_44c;
        uVar42 = (undefined2)(BStack_44c >> 0x10);
        uVar27 = local_468._0_4_;
        uVar28 = local_468._4_4_;
        uVar40 = uStack_450;
        uVar43 = uStack_448;
        uVar44 = SStack_444;
        uVar45 = EStack_442;
        in_stack_fffffffffffffb17 = local_441;
        uVar46 = LStack_440;
        in_stack_fffffffffffffb1c = BStack_43c;
        DynamicValue::Reader::operator=((Reader *)&local_3b8,(Reader *)&stack0xfffffffffffffae8);
        DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffae8);
      }
      else if ((uVar13 & 0xffff) == 0x10) {
        Type::asStruct(&local_498);
        reader_00.capTable = (CapTableReader *)uVar35;
        reader_00.segment = (SegmentReader *)uVar12;
        reader_00.pointer = (WirePointer *)this;
        reader_00.nestingLimit = TVar36;
        reader_00._28_4_ = uVar26;
        capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                  (reader_00,(StructSchema)stack0xfffffffffffffc00);
        TVar36 = STRUCT;
        uVar37 = CONCAT44(aStack_460.scopeId._4_4_,aStack_460.scopeId._0_4_);
        uVar33 = (undefined4)uStack_458;
        uVar38 = (undefined2)((uint7)uStack_458 >> 0x20);
        uVar39 = (undefined2)(CONCAT17(uStack_451,uStack_458) >> 0x30);
        uVar41 = (undefined2)BStack_44c;
        uVar42 = (undefined2)(BStack_44c >> 0x10);
        uVar27 = local_468._0_4_;
        uVar28 = local_468._4_4_;
        uVar40 = uStack_450;
        uVar43 = uStack_448;
        uVar44 = SStack_444;
        uVar45 = EStack_442;
        in_stack_fffffffffffffb17 = local_441;
        uVar46 = LStack_440;
        in_stack_fffffffffffffb1c = BStack_43c;
        DynamicValue::Reader::operator=((Reader *)&local_3b8,(Reader *)&stack0xfffffffffffffae8);
        DynamicValue::Reader::~Reader((Reader *)&stack0xfffffffffffffae8);
      }
      else if ((uVar13 & 0xffff) != 0x12) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                  ((Fault *)&stack0xfffffffffffffae8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0xc4c,FAILED,(char *)0x0,
                   "\"Unrecognized AnyPointer-typed member of schema::Value.\"",
                   (char (*) [55])"Unrecognized AnyPointer-typed member of schema::Value.");
        kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffae8);
      }
    }
    if ((0xf < source._reader.dataSize) && (*source._reader.data == 5)) {
      if (local_4a8 < 0xc0) {
        pwVar16 = (word *)0x0;
      }
      else {
        pwVar16 = (local_4b8->ptr).ptr;
      }
      local_278 = 0;
      local_288 = 0;
      uStack_280 = 0;
      local_298 = 0;
      uStack_290 = 0;
      uStack_270 = 0x7fffffff;
      (*this->resolver->_vptr_Resolver[6])(&stack0xfffffffffffffae8,this->resolver,pwVar16);
      local_498.baseType._0_1_ = SUB41(TVar36,0);
      TVar7 = local_498;
      if (SUB41(TVar36,0) == true) {
        local_498.field_4.scopeId._4_4_ = uVar28;
        local_498.field_4.scopeId._0_4_ = uVar27;
        local_498._0_8_ = TVar7._0_8_;
        Schema::getProto((Reader *)&stack0xfffffffffffffae8,(Schema *)&local_498.field_4);
        pcVar11 = "";
        local_418 = "";
        local_410 = 1;
        lVar17 = 1;
        if ((0x6f < (uint)uVar40) &&
           ((((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(uVar37 + 0xc))->structRef).dataSize.
            value != 0)) {
          bVar25 = uVar41 == 0;
          uVar12 = CONCAT26(uVar39,CONCAT24(uVar38,uVar33));
          if (bVar25) {
            uVar12 = 0;
          }
          uStack_450 = 0x7fffffff;
          if (!bVar25) {
            uStack_450 = uVar43;
          }
          aStack_460._0_1_ = false;
          aStack_460._1_3_ = 0;
          local_468._0_4_ = UNKNOWN;
          local_468._4_4_ = 0;
          aStack_460.scopeId._4_4_ = 0;
          if (!bVar25) {
            local_468._0_4_ = TVar36;
            local_468._4_4_ = uVar26;
            aStack_460.scopeId._0_4_ = uVar27;
            aStack_460.scopeId._4_4_ = uVar28;
          }
          uStack_458 = (undefined7)uVar12;
          uStack_451 = (undefined1)((ulong)uVar12 >> 0x38);
          RVar30 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)local_468,(void *)0x0,0);
          if ((uint)uVar40 < 0x60) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(((SegmentReader *)uVar37)->id).value;
          }
          pcVar11 = RVar30.super_StringPtr.content.ptr + uVar21;
          lVar17 = RVar30.super_StringPtr.content.size_ - uVar21;
        }
        bVar25 = source._reader.pointerCount == 0;
        local_3f8 = source._reader.pointers;
        if (bVar25) {
          local_3f8 = (WirePointer *)0x0;
        }
        LStack_3f0 = 0x7fffffff;
        if (!bVar25) {
          LStack_3f0 = source._reader.nestingLimit;
        }
        local_408._0_4_ = 0;
        local_408._4_4_ = 0;
        uVar26 = 0;
        uVar29 = 0;
        if (!bVar25) {
          local_408._0_4_ = source._reader.segment._0_4_;
          local_408._4_4_ = source._reader.segment._4_4_;
          uVar26 = source._reader.capTable._0_4_;
          uVar29 = source._reader.capTable._4_4_;
        }
        stack0xfffffffffffffc00 = (RawBrandedSchema *)CONCAT44(uVar29,uVar26);
        local_418 = pcVar11;
        local_410 = lVar17;
        capnp::_::PointerReader::getStruct
                  ((StructReader *)local_468,(PointerReader *)local_408,(word *)0x0);
        bVar25 = SStack_444 == 0;
        local_3f8 = (WirePointer *)CONCAT44(BStack_44c,uStack_450);
        if (bVar25) {
          local_3f8 = (WirePointer *)0x0;
        }
        LStack_3f0 = 0x7fffffff;
        if (!bVar25) {
          LStack_3f0 = LStack_440;
        }
        uVar26._0_1_ = false;
        uVar26._1_3_ = 0;
        local_408._0_4_ = UNKNOWN;
        local_408._4_4_ = 0;
        uVar29 = 0;
        if (!bVar25) {
          local_408._0_4_ = local_468._0_4_;
          local_408._4_4_ = local_468._4_4_;
          uVar26 = aStack_460.scopeId._0_4_;
          uVar29 = aStack_460.scopeId._4_4_;
        }
        stack0xfffffffffffffc00 = (RawBrandedSchema *)CONCAT44(uVar29,uVar26);
        local_2e8 = (ArrayPtr<const_char>)
                    capnp::_::PointerReader::getBlob<capnp::Text>
                              ((PointerReader *)local_408,(void *)0x0,0);
        pEVar3 = this->errorReporter;
        name_00._reader.segment._4_4_ = uVar28;
        name_00._reader.segment._0_4_ = uVar27;
        name_00._reader.capTable = (CapTableReader *)uVar37;
        name_00._reader.data._0_4_ = uVar33;
        name_00._reader.data._4_2_ = uVar38;
        name_00._reader.data._6_2_ = uVar39;
        name_00._reader.pointers._0_4_ = uVar40;
        name_00._reader.pointers._4_2_ = uVar41;
        name_00._reader.pointers._6_2_ = uVar42;
        name_00._reader.dataSize = uVar43;
        name_00._reader.pointerCount = uVar44;
        name_00._reader._38_1_ = uVar45;
        name_00._reader._39_1_ = in_stack_fffffffffffffb17;
        name_00._reader.nestingLimit = uVar46;
        name_00._reader._44_4_ = in_stack_fffffffffffffb1c;
        expressionString(name_00);
        kj::
        str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
                  ((String *)local_468,
                   (kj *)"Constant names must be qualified to avoid confusion.  Please replace \'",
                   (char (*) [71])local_408,(String *)"\' with \'",(char (*) [9])&local_418,
                   (StringPtr *)0x55a5b4,(char (*) [2])&local_2e8,
                   (StringPtr *)"\', if that\'s what you intended.",
                   (char (*) [32])CONCAT44(uVar32,uVar31));
        lVar17 = CONCAT44(aStack_460.scopeId._4_4_,aStack_460.scopeId._0_4_);
        if (lVar17 == 0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = (char *)CONCAT44(local_468._4_4_,local_468._0_4_);
        }
        uVar21 = 0;
        if (source._reader.dataSize < 0x40) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)*(uint *)((long)source._reader.data + 4);
          if (0x9f < source._reader.dataSize) {
            uVar21 = (ulong)*(uint *)((long)source._reader.data + 0x10);
          }
        }
        (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar23,uVar21,pcVar11,lVar17 + (ulong)(lVar17 == 0));
        lVar17 = CONCAT44(local_468._4_4_,local_468._0_4_);
        if (lVar17 != 0) {
          uVar12 = CONCAT44(aStack_460.scopeId._4_4_,aStack_460.scopeId._0_4_);
          local_468._0_4_ = UNKNOWN;
          local_468._4_4_ = 0;
          aStack_460.scopeId._0_4_ = 0;
          aStack_460.scopeId._4_4_ = 0;
          (*(code *)**(undefined8 **)CONCAT17(uStack_451,uStack_458))
                    ((undefined8 *)CONCAT17(uStack_451,uStack_458),lVar17,1,uVar12,uVar12,0);
        }
        pRVar8 = stack0xfffffffffffffc00;
        uVar12 = local_408._0_8_;
        if ((SegmentBuilder *)local_408._0_8_ != (SegmentBuilder *)0x0) {
          local_408._0_8_ = (SegmentBuilder *)0x0;
          stack0xfffffffffffffc00 = (RawBrandedSchema *)0x0;
          (**(code **)*local_3f8)(local_3f8,uVar12,1,pRVar8,pRVar8,0);
        }
      }
    }
    __return_storage_ptr__ = local_478;
    (local_478->ptr).isSet = true;
    DynamicValue::Reader::Reader(&(local_478->ptr).field_1.value,(Reader *)&local_3b8);
    DynamicValue::Reader::~Reader((Reader *)&local_3b8);
  }
  else {
LAB_00437583:
    (__return_storage_ptr__->ptr).isSet = false;
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_268);
LAB_00437bfa:
  pBVar22 = local_108.brand.ptr;
  if (local_108.brand.ptr != (BrandScope *)0x0) {
    local_108.brand.ptr = (BrandScope *)0x0;
    (**(local_108.brand.disposer)->_vptr_Disposer)
              (local_108.brand.disposer,
               (pBVar22->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)&(pBVar22->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<DynamicValue::Reader> NodeTranslator::readConstant(
    Expression::Reader source, bool isBootstrap) {
  // Look up the constant decl.
  NodeTranslator::BrandedDecl constDecl = nullptr;
  KJ_IF_MAYBE(decl, compileDeclExpression(source, noImplicitParams())) {
    constDecl = *decl;
  } else {
    // Lookup will have reported an error.
    return nullptr;
  }

  // Is it a constant?
  if(constDecl.getKind().orDefault(Declaration::FILE) != Declaration::CONST) {
    errorReporter.addErrorOn(source,
        kj::str("'", expressionString(source), "' does not refer to a constant."));
    return nullptr;
  }

  // Extract the ID and brand.
  MallocMessageBuilder builder(256);
  auto constBrand = builder.getRoot<schema::Brand>();
  uint64_t id = constDecl.getIdAndFillBrand([&]() { return constBrand; });

  // Look up the schema -- we'll need this to compile the constant's type.
  Schema constSchema;
  KJ_IF_MAYBE(s, resolver.resolveBootstrapSchema(id, constBrand)) {
    constSchema = *s;
  } else {
    // The constant's schema is broken for reasons already reported.
    return nullptr;
  }

  // If we're bootstrapping, then we know we're expecting a primitive value, so if the
  // constant turns out to be non-primitive, we'll error out anyway.  If we're not
  // bootstrapping, we may be compiling a non-primitive value and so we need the final
  // version of the constant to make sure its value is filled in.
  schema::Node::Reader proto = constSchema.getProto();
  if (!isBootstrap) {
    KJ_IF_MAYBE(finalProto, resolver.resolveFinalSchema(id)) {
      proto = *finalProto;
    } else {
      // The constant's final schema is broken for reasons already reported.
      return nullptr;
    }
  }

  auto constReader = proto.getConst();
  auto dynamicConst = toDynamic(constReader.getValue());
  auto constValue = dynamicConst.get(KJ_ASSERT_NONNULL(dynamicConst.which()));

  if (constValue.getType() == DynamicValue::ANY_POINTER) {
    // We need to assign an appropriate schema to this pointer.
    AnyPointer::Reader objValue = constValue.as<AnyPointer>();

    auto constType = constSchema.asConst().getType();
    switch (constType.which()) {
      case schema::Type::STRUCT:
        constValue = objValue.getAs<DynamicStruct>(constType.asStruct());
        break;
      case schema::Type::LIST:
        constValue = objValue.getAs<DynamicList>(constType.asList());
        break;
      case schema::Type::ANY_POINTER:
        // Fine as-is.
        break;
      default:
        KJ_FAIL_ASSERT("Unrecognized AnyPointer-typed member of schema::Value.");
        break;
    }
  }

  if (source.isRelativeName()) {
    // A fully unqualified identifier looks like it might refer to a constant visible in the
    // current scope, but if that's really what the user wanted, we want them to use a
    // qualified name to make it more obvious.  Report an error.
    KJ_IF_MAYBE(scope, resolver.resolveBootstrapSchema(proto.getScopeId(),
                                                       schema::Brand::Reader())) {
      auto scopeReader = scope->getProto();
      kj::StringPtr parent;
      if (scopeReader.isFile()) {
        parent = "";
      } else {
        parent = scopeReader.getDisplayName().slice(scopeReader.getDisplayNamePrefixLength());
      }
      kj::StringPtr id = source.getRelativeName().getValue();

      errorReporter.addErrorOn(source, kj::str(
          "Constant names must be qualified to avoid confusion.  Please replace '",
          expressionString(source), "' with '", parent, ".", id,
          "', if that's what you intended."));
    }
  }

  return constValue;
}